

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void EDCircles::ComputeCirclePoints
               (double xc,double yc,double r,double *px,double *py,int *noPoints)

{
  long lVar1;
  double __x;
  double dVar2;
  double dVar3;
  
  __x = 0.0;
  lVar1 = 0;
  do {
    dVar2 = cos(__x);
    dVar3 = sin(__x);
    __x = __x + 6.283185307179586 / (double)(int)(r * 6.283185307179586 + 0.5);
    px[lVar1] = (double)(int)(dVar2 * r + xc + 0.5);
    py[lVar1] = (double)(int)(dVar3 * r + yc + 0.5);
    lVar1 = lVar1 + 1;
  } while (__x < 6.283185307179586);
  *noPoints = (int)lVar1;
  return;
}

Assistant:

void EDCircles::ComputeCirclePoints(double xc, double yc, double r, double * px, double * py, int * noPoints)
{
	int len = (int)(TWOPI*r + 0.5);
	double angleInc = TWOPI / len;
	double angle = 0;

	int prevX = -1;
	int prevY = -1;
	int count = 0;

	while (angle < TWOPI) {
		int x = (int)(cos(angle)*r + xc + 0.5);
		int y = (int)(sin(angle)*r + yc + 0.5);

		angle += angleInc;

		px[count] = x;
		py[count] = y;
		count++;
	} //end-while

	*noPoints = count;
}